

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.hpp
# Opt level: O0

void __thiscall gl4cts::GPUShaderFP64Test3::~GPUShaderFP64Test3(GPUShaderFP64Test3 *this)

{
  GPUShaderFP64Test3 *this_local;
  
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__GPUShaderFP64Test3_0323df40;
  std::
  vector<gl4cts::GPUShaderFP64Test3::uniformDetails,_std::allocator<gl4cts::GPUShaderFP64Test3::uniformDetails>_>
  ::~vector(&this->m_uniform_details);
  programInfo::~programInfo(&this->m_std140_program);
  programInfo::~programInfo(&this->m_shared_program);
  programInfo::~programInfo(&this->m_packed_program);
  deqp::TestCase::~TestCase(&this->super_TestCase);
  return;
}

Assistant:

virtual ~GPUShaderFP64Test3()
	{
	}